

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

dynamic_string * __thiscall
crnlib::dynamic_string::append(dynamic_string *this,dynamic_string *other)

{
  ushort uVar1;
  ushort uVar2;
  char *__src;
  uint uVar3;
  
  uVar1 = other->m_len;
  uVar3 = (uint)this->m_len + (uint)uVar1;
  if (uVar3 != 0) {
    uVar2 = this->m_buf_size;
    if (uVar2 <= uVar3 && uVar3 < 0xffff) {
      expand_buf(this,uVar3 + 1,true);
      uVar2 = this->m_buf_size;
    }
    if (uVar3 < uVar2) {
      __src = "";
      if (other->m_pStr != (char *)0x0) {
        __src = other->m_pStr;
      }
      memcpy(this->m_pStr + this->m_len,__src,(ulong)uVar1 + 1);
      this->m_len = this->m_len + uVar1;
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::append(const dynamic_string& other)
    {
        uint len = other.m_len;
        uint new_total_len = m_len + len;
        if ((new_total_len) && ensure_buf(new_total_len))
        {
            memcpy(m_pStr + m_len, other.get_ptr_priv(), len + 1);
            m_len = static_cast<uint16>(m_len + len);
            check();
        }

        return *this;
    }